

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

void __thiscall Js::JavascriptSet::AddToEmptySet(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  BVIndex i;
  undefined4 *puVar4;
  Recycler *pRVar5;
  BVSparse<Memory::Recycler> *this_00;
  Var pvVar6;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  undefined **local_78;
  SetDataNode *node;
  size_t local_68;
  char *local_60;
  DWORD local_58;
  Var local_50;
  Var value_local;
  Var taggedInt;
  Var simpleVar;
  
  local_50 = value;
  if (this->kind != EmptySet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x13e,"(this->kind == SetKind::EmptySet)",
                                "this->kind == SetKind::EmptySet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  value_local = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,false>(value);
  if (value_local == (Var)0x0) {
    pvVar6 = JavascriptConversion::TryCanonicalizeAsSimpleVar<false>(value);
    taggedInt = pvVar6;
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    simpleVar = &this->u;
    if (pvVar6 == (Var)0x0) {
      local_78 = &JsUtil::
                  BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      node = (SetDataNode *)0x0;
      local_68 = 0xffffffffffffffff;
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
      ;
      local_58 = 0x15c;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)&stack0xffffffffffffff88);
      this_02 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar5,0x37a1d4);
      pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,pRVar5,0);
      pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      local_78 = (undefined **)MapOrSetDataList<void_*>::Append(&this->list,&local_50,pRVar5);
      JsUtil::
      BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_02,&local_50,(MapOrSetDataNode<void_*> **)&stack0xffffffffffffff88);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::WriteBarrierSet((WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)simpleVar,this_02);
      TVar3 = ComplexVarSet;
    }
    else {
      local_78 = &JsUtil::
                  BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      node = (SetDataNode *)0x0;
      local_68 = 0xffffffffffffffff;
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
      ;
      local_58 = 0x152;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)&stack0xffffffffffffff88);
      this_01 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar5,0x37a1d4);
      pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,pRVar5,0);
      pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      local_78 = (undefined **)MapOrSetDataList<void_*>::Append(&this->list,&taggedInt,pRVar5);
      JsUtil::
      BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_01,&taggedInt,(MapOrSetDataNode<void_*> **)&stack0xffffffffffffff88);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::WriteBarrierSet((WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)simpleVar,this_01);
      TVar3 = SimpleVarSet;
    }
    this->kind = TVar3;
  }
  else {
    i = TaggedInt::ToInt32(value_local);
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    local_78 = &BVSparse<Memory::Recycler>::typeinfo;
    node = (SetDataNode *)0x0;
    local_68 = 0xffffffffffffffff;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
    ;
    local_58 = 0x145;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)&stack0xffffffffffffff88);
    this_00 = (BVSparse<Memory::Recycler> *)new<Memory::Recycler>(0x20,pRVar5,0x37a1d4);
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    BVSparse<Memory::Recycler>::BVSparse(this_00,pRVar5);
    BVSparse<Memory::Recycler>::Set(this_00,i);
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    MapOrSetDataList<void_*>::Append(&this->list,&value_local,pRVar5);
    Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::WriteBarrierSet
              ((WriteBarrierPtr<BVSparse<Memory::Recycler>_> *)&(this->u).simpleVarSet,this_00);
    this->kind = IntSet;
  }
  return;
}

Assistant:

void
JavascriptSet::AddToEmptySet(Var value)
{
    Assert(this->kind == SetKind::EmptySet);
    // We cannot store an int with value -1 inside of a bit vector
    Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, false /* allowLossyConversion */>(value);
    if (taggedInt)
    {
        int32 intVal = TaggedInt::ToInt32(taggedInt);

        BVSparse<Recycler>* newIntSet = RecyclerNew(this->GetRecycler(), BVSparse<Recycler>, this->GetRecycler());
        newIntSet->Set(intVal);

        this->list.Append(taggedInt, this->GetRecycler());

        this->u.intSet = newIntSet;
        this->kind = SetKind::IntSet;
        return;
    }

    Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<false /* allowLossyConversion */>(value);
    if (simpleVar)
    {
        SimpleVarDataSet* newSimpleSet = RecyclerNew(this->GetRecycler(), SimpleVarDataSet, this->GetRecycler());
        SetDataNode* node = this->list.Append(simpleVar, this->GetRecycler());

        newSimpleSet->Add(simpleVar, node);

        this->u.simpleVarSet = newSimpleSet;
        this->kind = SetKind::SimpleVarSet;
        return;
    }

    ComplexVarDataSet* newComplexSet = RecyclerNew(this->GetRecycler(), ComplexVarDataSet, this->GetRecycler());
    SetDataNode* node = this->list.Append(value, this->GetRecycler());

    newComplexSet->Add(value, node);

    this->u.complexVarSet = newComplexSet;
    this->kind = SetKind::ComplexVarSet;
}